

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# debug.h
# Opt level: O2

void __thiscall
kj::_::Debug::Fault::
Fault<kj::Exception::Type,char_const(&)[66],kj::ArrayPtr<unsigned_char_const>&,kj::ArrayPtr<unsigned_char_const>&,std::__cxx11::string_const&>
          (Fault *this,char *file,int line,Type code,char *condition,char *macroArgs,
          char (*params) [66],ArrayPtr<const_unsigned_char> *params_1,
          ArrayPtr<const_unsigned_char> *params_2,
          basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *params_3)

{
  undefined4 in_register_00000014;
  ArrayPtr<const_unsigned_char> *params_00;
  ArrayPtr<const_unsigned_char> *params_01;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *params_02;
  long lVar1;
  String argValues [4];
  
  this->exception = (Exception *)0x0;
  str<char_const(&)[66]>(argValues,(kj *)params,(char (*) [66])CONCAT44(in_register_00000014,line));
  str<kj::ArrayPtr<unsigned_char_const>&>(argValues + 1,(kj *)params_1,params_00);
  str<kj::ArrayPtr<unsigned_char_const>&>(argValues + 2,(kj *)params_2,params_01);
  str<std::__cxx11::string_const&>(argValues + 3,(kj *)params_3,params_02);
  init(this,(EVP_PKEY_CTX *)file);
  lVar1 = 0x48;
  do {
    Array<char>::~Array((Array<char> *)((long)&argValues[0].content.ptr + lVar1));
    lVar1 = lVar1 + -0x18;
  } while (lVar1 != -0x18);
  return;
}

Assistant:

Debug::Fault::Fault(const char* file, int line, Code code,
                    const char* condition, const char* macroArgs, Params&&... params)
    : exception(nullptr) {
  String argValues[sizeof...(Params)] = {str(params)...};
  init(file, line, code, condition, macroArgs,
       arrayPtr(argValues, sizeof...(Params)));
}